

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceLocation __thiscall
slang::SourceManager::getExpansionLoc(SourceManager *this,SourceLocation location)

{
  shared_lock<std::shared_mutex> *in_RDI;
  shared_lock<std::shared_mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  shared_lock<std::shared_mutex> *in_stack_ffffffffffffffa0;
  SourceManager *in_stack_ffffffffffffffa8;
  SourceLocation in_stack_ffffffffffffffb0;
  SourceRange local_38 [3];
  SourceLocation local_8;
  
  std::shared_lock<std::shared_mutex>::shared_lock(in_RDI,in_stack_ffffffffffffff88);
  local_38[0] = getExpansionRangeImpl<std::shared_lock<std::shared_mutex>_>
                          (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa0);
  local_8 = SourceRange::start(local_38);
  std::shared_lock<std::shared_mutex>::~shared_lock(in_RDI);
  return local_8;
}

Assistant:

SourceLocation SourceManager::getExpansionLoc(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    return getExpansionRangeImpl(location, lock).start();
}